

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::GenericClassDefSymbol::SpecializationKey::SpecializationKey
          (SpecializationKey *this,GenericClassDefSymbol *def,
          span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues,
          span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams)

{
  ConstantValue *this_00;
  Type *this_01;
  long lVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  this->definition = def;
  (this->paramValues).data_ = paramValues.data_;
  (this->paramValues).size_ = paramValues.size_;
  (this->typeParams).data_ = typeParams.data_;
  (this->typeParams).size_ = typeParams.size_;
  pcVar4 = def[0x496038].paramDecls.stackBase + 0x69;
  for (lVar3 = 0; paramValues.size_ << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_00 = *(ConstantValue **)((long)paramValues.data_ + lVar3);
    lVar1 = 0x9e3779b9;
    if (this_00 != (ConstantValue *)0x0) {
      sVar2 = ConstantValue::hash(this_00);
      lVar1 = sVar2 + 0x9e3779b9;
    }
    pcVar4 = (char *)((ulong)pcVar4 ^ ((ulong)pcVar4 >> 2) + (long)pcVar4 * 0x40 + lVar1);
  }
  for (lVar3 = 0; typeParams.size_ << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_01 = *(Type **)((long)typeParams.data_ + lVar3);
    lVar1 = 0x9e3779b9;
    if (this_01 != (Type *)0x0) {
      sVar2 = Type::hash(this_01);
      lVar1 = sVar2 + 0x9e3779b9;
    }
    pcVar4 = (char *)((ulong)pcVar4 ^ ((ulong)pcVar4 >> 2) + (long)pcVar4 * 0x40 + lVar1);
  }
  this->savedHash = (size_t)pcVar4;
  return;
}

Assistant:

GenericClassDefSymbol::SpecializationKey::SpecializationKey(
    const GenericClassDefSymbol& def, span<const ConstantValue* const> paramValues,
    span<const Type* const> typeParams) :
    definition(&def),
    paramValues(paramValues), typeParams(typeParams) {

    // Precompute the hash.
    size_t h = 0;
    hash_combine(h, definition);
    for (auto val : paramValues)
        hash_combine(h, val ? val->hash() : 0);
    for (auto type : typeParams)
        hash_combine(h, type ? type->hash() : 0);
    savedHash = h;
}